

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O2

void __thiscall inja::FileError::~FileError(FileError *this)

{
  InjaError::~InjaError(&this->super_InjaError);
  operator_delete(this,0x60);
  return;
}

Assistant:

explicit FileError(const std::string& message): InjaError("file_error", message) {}